

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_decimalquantity.cpp
# Opt level: O2

void __thiscall
icu_63::number::impl::DecimalQuantity::appendDigit
          (DecimalQuantity *this,int8_t value,int32_t leadingZeros,bool appendAsInteger)

{
  if (value == '\0') {
    if ((appendAsInteger) && (this->precision != 0)) {
      this->scale = this->scale + leadingZeros + 1;
    }
  }
  else {
    if ((0 < this->scale) && (leadingZeros = this->scale + leadingZeros, appendAsInteger)) {
      this->scale = 0;
    }
    shiftLeft(this,leadingZeros + 1);
    setDigitPos(this,0,value);
    if (appendAsInteger) {
      this->scale = this->scale + leadingZeros + 1;
    }
  }
  return;
}

Assistant:

void DecimalQuantity::appendDigit(int8_t value, int32_t leadingZeros, bool appendAsInteger) {
    U_ASSERT(leadingZeros >= 0);

    // Zero requires special handling to maintain the invariant that the least-significant digit
    // in the BCD is nonzero.
    if (value == 0) {
        if (appendAsInteger && precision != 0) {
            scale += leadingZeros + 1;
        }
        return;
    }

    // Deal with trailing zeros
    if (scale > 0) {
        leadingZeros += scale;
        if (appendAsInteger) {
            scale = 0;
        }
    }

    // Append digit
    shiftLeft(leadingZeros + 1);
    setDigitPos(0, value);

    // Fix scale if in integer mode
    if (appendAsInteger) {
        scale += leadingZeros + 1;
    }
}